

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeGetStackPos(AsyncifyBuilder *this)

{
  uint bytes;
  uint align;
  GlobalGet *ptr;
  Load *pLVar1;
  Name name;
  
  bytes = wasm::Type::getByteSize(&this->pointerType);
  align = wasm::Type::getByteSize(&this->pointerType);
  name.super_IString.str._M_str = DAT_01175718;
  name.super_IString.str._M_len = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
  ptr = Builder::makeGlobalGet(&this->super_Builder,name,(Type)(this->pointerType).id);
  pLVar1 = Builder::makeLoad(&this->super_Builder,bytes,false,(Address)0x0,align,(Expression *)ptr,
                             (Type)(this->pointerType).id,
                             (Name)(this->asyncifyMemory).super_IString.str);
  return (Expression *)pLVar1;
}

Assistant:

Expression* makeGetStackPos() {
    return makeLoad(pointerType.getByteSize(),
                    false,
                    int(DataOffset::BStackPos),
                    pointerType.getByteSize(),
                    makeGlobalGet(ASYNCIFY_DATA, pointerType),
                    pointerType,
                    asyncifyMemory);
  }